

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::CreateFilterFromJoinStats
          (StatisticsPropagator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *child,unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr
          ,BaseStatistics *stats_before,BaseStatistics *stats_after)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer pEVar5;
  ClientContext *pCVar6;
  unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
  uVar7;
  pointer pLVar8;
  pointer pLVar9;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *filter_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *__args;
  templated_unique_single_t filter;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  filter_exprs;
  Value max_after;
  Value min_after;
  FilterPushdown filter_pushdown;
  Value max_before;
  Value min_before;
  undefined1 local_288 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_268;
  undefined1 local_250 [72];
  Value local_208;
  FilterPushdown local_1c8;
  Value local_a8;
  Value local_68;
  
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar5->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    bVar4 = LogicalType::IsIntegral(&pEVar5->return_type);
    if (((bVar4) && (bVar4 = NumericStats::HasMinMax(stats_before), bVar4)) &&
       (bVar4 = NumericStats::HasMinMax(stats_after), bVar4)) {
      NumericStats::Min(&local_68,stats_before);
      NumericStats::Max(&local_a8,stats_before);
      NumericStats::Min(&local_208,stats_after);
      NumericStats::Max((Value *)(local_250 + 8),stats_after);
      local_268.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
      local_268.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
      local_268.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = Value::operator>(&local_208,&local_68);
      if (bVar4) {
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0x11])(local_288 + 0x10,pEVar5);
        pCVar6 = (ClientContext *)operator_new(0x98);
        Value::Value((Value *)&local_1c8,&local_208);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)pCVar6,(Value *)&local_1c8);
        Value::~Value((Value *)&local_1c8);
        uVar7._M_t.
        super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
        .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true,_true>
              )operator_new(0x68);
        local_1c8.optimizer = (Optimizer *)local_288._16_8_;
        local_288._16_8_ = (Optimizer *)0x0;
        local_288._8_8_ = pCVar6;
        BoundComparisonExpression::BoundComparisonExpression
                  ((BoundComparisonExpression *)
                   uVar7._M_t.
                   super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                   .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl,
                   COMPARE_GREATERTHANOREQUALTO,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_1c8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   (local_288 + 8));
        local_288._0_8_ =
             uVar7._M_t.
             super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
             .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl;
        if ((ClientContext *)local_288._8_8_ != (ClientContext *)0x0) {
          (*(((Expression *)local_288._8_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_288._8_8_ = (ClientContext *)0x0;
        if (local_1c8.optimizer != (Optimizer *)0x0) {
          (**(code **)((long)(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                *)&(local_1c8.optimizer)->context)->_M_t).
                             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                             .super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_268,
                   (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                    *)local_288);
        if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
             )local_288._0_8_ != (BoundComparisonExpression *)0x0) {
          (**(code **)(*(long *)local_288._0_8_ + 8))();
        }
        local_288._0_8_ =
             (tuple<duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
              )0x0;
        if ((Optimizer *)local_288._16_8_ != (Optimizer *)0x0) {
          (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)local_288._16_8_)->_M_t).
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
      }
      bVar4 = Value::operator<((Value *)(local_250 + 8),&local_a8);
      if (bVar4) {
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0x11])(local_288 + 0x10,pEVar5);
        pCVar6 = (ClientContext *)operator_new(0x98);
        Value::Value((Value *)&local_1c8,(Value *)(local_250 + 8));
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)pCVar6,(Value *)&local_1c8);
        Value::~Value((Value *)&local_1c8);
        uVar7._M_t.
        super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
        .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true,_true>
              )operator_new(0x68);
        local_1c8.optimizer = (Optimizer *)local_288._16_8_;
        local_288._16_8_ = (Optimizer *)0x0;
        local_288._8_8_ = pCVar6;
        BoundComparisonExpression::BoundComparisonExpression
                  ((BoundComparisonExpression *)
                   uVar7._M_t.
                   super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                   .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl,
                   COMPARE_LESSTHANOREQUALTO,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_1c8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   (local_288 + 8));
        local_288._0_8_ =
             uVar7._M_t.
             super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
             .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl;
        if ((ClientContext *)local_288._8_8_ != (ClientContext *)0x0) {
          (*(((Expression *)local_288._8_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_288._8_8_ = (ClientContext *)0x0;
        if (local_1c8.optimizer != (Optimizer *)0x0) {
          (**(code **)((long)(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                *)&(local_1c8.optimizer)->context)->_M_t).
                             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                             .super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_268,
                   (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                    *)local_288);
        if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
             )local_288._0_8_ != (BoundComparisonExpression *)0x0) {
          (**(code **)(*(long *)local_288._0_8_ + 8))();
        }
        local_288._0_8_ =
             (tuple<duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
              )0x0;
        if ((Optimizer *)local_288._16_8_ != (Optimizer *)0x0) {
          (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)local_288._16_8_)->_M_t).
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
      }
      if (local_268.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_268.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar6 = (ClientContext *)operator_new(0x80);
        LogicalFilter::LogicalFilter((LogicalFilter *)pCVar6);
        local_288._8_8_ = pCVar6;
        pLVar8 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                 ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                               *)(local_288 + 8));
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar8->super_LogicalOperator).children,child);
        uVar3 = local_288._8_8_;
        local_288._8_8_ = (ClientContext *)0x0;
        _Var1._M_head_impl =
             (child->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (child->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar3;
        __args = local_268.
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = local_268.
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
          __args = local_268.
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = local_268.
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; __args != puVar2; __args = __args + 1) {
          pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator->(child);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pLVar9->expressions,__args);
        }
        FilterPushdown::FilterPushdown(&local_1c8,this->optimizer,false);
        local_288._24_8_ =
             (child->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (child->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        FilterPushdown::Rewrite
                  ((FilterPushdown *)local_288,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_1c8);
        uVar3 = local_288._0_8_;
        local_288._0_8_ = (BoundComparisonExpression *)0x0;
        _Var1._M_head_impl =
             (child->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (child->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar3;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
             )local_288._0_8_ != (BoundComparisonExpression *)0x0) {
          (**(code **)(*(long *)local_288._0_8_ + 8))();
        }
        local_288._0_8_ =
             (_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
              )0x0;
        if ((LogicalOperator *)local_288._24_8_ != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)local_288._24_8_)[1])();
        }
        local_288._24_8_ = (pointer)0x0;
        PropagateExpression((StatisticsPropagator *)local_250,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this);
        if ((BaseStatistics *)local_250._0_8_ != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics((BaseStatistics *)local_250._0_8_);
          operator_delete((void *)local_250._0_8_);
        }
        local_250._0_8_ = (BaseStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
        ::~vector(&local_1c8.filters.
                   super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                 );
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
        ::~_Rb_tree(&local_1c8.combiner.equivalence_map._M_t);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
        ::~_Rb_tree(&local_1c8.combiner.constant_values._M_t);
        ::std::
        _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_1c8.combiner.equivalence_set_map._M_h);
        ::std::
        _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_1c8.combiner.stored_expressions._M_h);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_1c8.combiner.remaining_filters.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 );
        if ((ClientContext *)local_288._8_8_ != (ClientContext *)0x0) {
          (**(code **)((long)(((enable_shared_from_this<duckdb::ClientContext> *)local_288._8_8_)->
                             __weak_this_).internal.
                             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 8))();
        }
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_268);
      Value::~Value((Value *)(local_250 + 8));
      Value::~Value(&local_208);
      Value::~Value(&local_a8);
      Value::~Value(&local_68);
    }
  }
  return;
}

Assistant:

void StatisticsPropagator::CreateFilterFromJoinStats(unique_ptr<LogicalOperator> &child, unique_ptr<Expression> &expr,
                                                     const BaseStatistics &stats_before,
                                                     const BaseStatistics &stats_after) {
	// Only do this for integral colref's that have stats
	if (expr->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF || !expr->return_type.IsIntegral() ||
	    !NumericStats::HasMinMax(stats_before) || !NumericStats::HasMinMax(stats_after)) {
		return;
	}

	// Retrieve min/max
	auto min_before = NumericStats::Min(stats_before);
	auto max_before = NumericStats::Max(stats_before);
	auto min_after = NumericStats::Min(stats_after);
	auto max_after = NumericStats::Max(stats_after);

	vector<unique_ptr<Expression>> filter_exprs;
	if (min_after > min_before) {
		filter_exprs.emplace_back(
		    make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, expr->Copy(),
		                                         make_uniq<BoundConstantExpression>(std::move(min_after))));
	}
	if (max_after < max_before) {
		filter_exprs.emplace_back(
		    make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_LESSTHANOREQUALTO, expr->Copy(),
		                                         make_uniq<BoundConstantExpression>(std::move(max_after))));
	}

	if (filter_exprs.empty()) {
		return;
	}

	auto filter = make_uniq<LogicalFilter>();
	filter->children.emplace_back(std::move(child));
	child = std::move(filter);

	for (auto &filter_expr : filter_exprs) {
		child->expressions.emplace_back(std::move(filter_expr));
	}

	// not allowed to let filter pushdown change mark joins to semi joins.
	// semi joins are potentially slower AND the conversion can ruin column binding information
	FilterPushdown filter_pushdown(optimizer, false);
	child = filter_pushdown.Rewrite(std::move(child));
	PropagateExpression(expr);
}